

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedStoragesList.hpp
# Opt level: O1

void __thiscall
supermap::
SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>
::SortedStoragesList
          (SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>
           *this)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  (this->
  super_Findable<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>).
  _vptr_Findable = (_func_int **)&PTR___cxa_pure_virtual_002079c0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/SortedStoragesList.hpp:35:55)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/SortedStoragesList.hpp:35:55)>
             ::_M_manager;
  OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_unsigned_long,_void>
  ::OrderedStorage(&this->
                    super_OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_unsigned_long,_void>
                   ,(InnerRegisterSupplier *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  (this->
  super_Findable<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>).
  _vptr_Findable = (_func_int **)&PTR___cxa_pure_virtual_00207cd0;
  (this->
  super_OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_unsigned_long,_void>
  )._vptr_OrderedStorage = (_func_int **)&PTR___cxa_pure_virtual_00207cf8;
  return;
}

Assistant:

SortedStoragesList()
        : OrderedStorage<SortedStorage, IndexT, void>([]() { return std::make_unique<StoragesRegister>(); }) {}